

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListReader * __thiscall
capnp::_::PointerReader::getListAnySize
          (ListReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *pWVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  StructDataBitCount SVar5;
  word *pwVar6;
  CapTableReader *pCVar7;
  Arena *pAVar8;
  ulong uVar9;
  ReadLimiter *pRVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SegmentReader *pSVar12;
  ulong uVar13;
  WirePointer *pWVar14;
  uint uVar15;
  SegmentReader *pSVar16;
  ulong uVar17;
  ElementSize EVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  WirePointer *pWVar23;
  Fault f;
  Fault local_38;
  
  pWVar23 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar23 = this->pointer;
  }
  pSVar12 = this->segment;
  pWVar1 = pWVar23 + 1;
  uVar15 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value;
  lVar20 = (long)((int)uVar15 >> 2);
  if (pSVar12 == (SegmentReader *)0x0) {
    pWVar14 = pWVar1 + lVar20;
  }
  else {
    pwVar6 = (pSVar12->ptr).ptr;
    pWVar14 = (WirePointer *)(pwVar6 + (pSVar12->ptr).size_);
    if (((long)pwVar6 - (long)pWVar1 >> 3 <= lVar20) &&
       (lVar20 <= (long)pWVar14 - (long)pWVar1 >> 3)) {
      pWVar14 = pWVar1 + lVar20;
    }
  }
  pCVar7 = this->capTable;
  iVar4 = this->nestingLimit;
  if ((pWVar23->field_1).upper32Bits == 0 && uVar15 == 0) goto LAB_001c48d4;
  if (iVar4 < 1) goto LAB_001c4ad9;
  if (pSVar12 == (SegmentReader *)0x0) {
    pSVar12 = (SegmentReader *)0x0;
LAB_001c48a6:
    if (pWVar14 == (WirePointer *)0x0) goto LAB_001c48d4;
  }
  else {
    if ((uVar15 & 3) != 2) goto LAB_001c48a6;
    iVar11 = (*pSVar12->arena->_vptr_Arena[2])();
    pSVar12 = (SegmentReader *)CONCAT44(extraout_var,iVar11);
    if (pSVar12 == (SegmentReader *)0x0) {
      getListAnySize();
      goto LAB_001c48d4;
    }
    uVar17 = (pSVar12->ptr).size_;
    uVar15 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value;
    uVar13 = (ulong)(uVar15 >> 3);
    if ((long)uVar17 < (long)(ulong)(uVar15 >> 3)) {
      uVar13 = uVar17;
    }
    uVar21 = 2 - (ulong)((uVar15 & 4) == 0);
    if (uVar17 < uVar13 + uVar21) {
LAB_001c48c1:
      getListAnySize();
      goto LAB_001c48d4;
    }
    pwVar6 = (pSVar12->ptr).ptr;
    pAVar8 = pSVar12->arena;
    uVar9 = pSVar12->readLimiter->limit;
    if (uVar9 < uVar21) {
      (*pAVar8->_vptr_Arena[3])();
      goto LAB_001c48c1;
    }
    pWVar23 = (WirePointer *)(pwVar6 + uVar13);
    pWVar1 = pWVar23 + 1;
    pSVar12->readLimiter->limit = uVar9 - uVar21;
    if ((uVar15 & 4) != 0) {
      iVar11 = (*pAVar8->_vptr_Arena[2])(pAVar8,(ulong)(pWVar23->field_1).upper32Bits);
      pSVar12 = (SegmentReader *)CONCAT44(extraout_var_00,iVar11);
      if (pSVar12 == (SegmentReader *)0x0) {
        getListAnySize();
        goto LAB_001c48d4;
      }
      uVar15 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value;
      if ((uVar15 & 3) != 2) {
        getListAnySize();
        goto LAB_001c48d4;
      }
      uVar13 = (ulong)(uVar15 >> 3);
      uVar17 = (pSVar12->ptr).size_;
      if ((long)uVar17 < (long)uVar13) {
        uVar13 = uVar17;
      }
      pWVar14 = (WirePointer *)((pSVar12->ptr).ptr + uVar13);
      pWVar23 = pWVar1;
      goto LAB_001c48a6;
    }
    uVar15 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value;
    lVar20 = (long)((int)uVar15 >> 2);
    pWVar14 = (WirePointer *)(pwVar6 + uVar17);
    if (((long)pwVar6 - (long)pWVar1 >> 3 <= lVar20) &&
       (lVar20 <= (long)pWVar14 - (long)pWVar1 >> 3)) {
      pWVar14 = pWVar1 + lVar20;
      goto LAB_001c4912;
    }
  }
  uVar15 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value;
LAB_001c4912:
  do {
    if ((uVar15 & 3) == 1) {
      uVar15 = (pWVar23->field_1).upper32Bits;
      EVar18 = (ElementSize)uVar15 & INLINE_COMPOSITE;
      if (EVar18 == INLINE_COMPOSITE) {
        uVar15 = uVar15 >> 3;
        if (pSVar12 == (SegmentReader *)0x0) {
LAB_001c496f:
          uVar19 = (uint)*(uint64_t *)&(pWVar14->offsetAndKind).value;
          if ((uVar19 & 3) == 0) {
            uVar19 = uVar19 >> 2 & 0x1fffffff;
            uVar17 = (ulong)uVar19;
            uVar2 = *(ushort *)&pWVar14->field_1;
            uVar3 = (pWVar14->field_1).structRef.ptrCount.value;
            uVar22 = (uint)uVar3 + (uint)uVar2;
            if (uVar22 * uVar17 < (ulong)uVar15 || uVar22 * uVar17 - (ulong)uVar15 == 0) {
              pSVar16 = (SegmentReader *)0x0;
              if (uVar22 != 0) {
                pSVar16 = pSVar12;
              }
              if ((pSVar12 != (SegmentReader *)0x0) && (uVar22 == 0)) {
                uVar13 = pSVar12->readLimiter->limit;
                if (uVar13 < uVar17) {
                  getListAnySize();
                  goto LAB_001c48d4;
                }
                pSVar12->readLimiter->limit = uVar13 - uVar17;
                pSVar16 = pSVar12;
              }
              __return_storage_ptr__->segment = pSVar16;
              __return_storage_ptr__->capTable = pCVar7;
              __return_storage_ptr__->ptr = (byte *)(pWVar14 + 1);
              __return_storage_ptr__->elementCount = uVar19;
              __return_storage_ptr__->step = uVar22 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = uVar3;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
code_r0x001c49dc:
              __return_storage_ptr__->nestingLimit = iVar4 + -1;
              return __return_storage_ptr__;
            }
            getListAnySize();
          }
          else {
            getListAnySize();
          }
        }
        else {
          if (((long)pWVar14 - (long)(pSVar12->ptr).ptr >> 3) + (ulong)uVar15 + 1 <=
              (pSVar12->ptr).size_) {
            uVar17 = (ulong)uVar15 + 1;
            uVar13 = pSVar12->readLimiter->limit;
            if (uVar17 <= uVar13) {
              pSVar12->readLimiter->limit = uVar13 - uVar17;
              goto LAB_001c496f;
            }
            (*pSVar12->arena->_vptr_Arena[3])();
          }
          getListAnySize();
        }
      }
      else {
        SVar5 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar15 & 7) * 4);
        uVar17 = (ulong)(uVar15 >> 3);
        uVar19 = (uint)(EVar18 == POINTER) * 0x40 + SVar5;
        if (pSVar12 == (SegmentReader *)0x0) {
LAB_001c4a7f:
          __return_storage_ptr__->segment = pSVar12;
          __return_storage_ptr__->capTable = pCVar7;
          __return_storage_ptr__->ptr = (byte *)pWVar14;
          __return_storage_ptr__->elementCount = uVar15 >> 3;
          __return_storage_ptr__->step = uVar19;
          __return_storage_ptr__->structDataSize = SVar5;
          __return_storage_ptr__->structPointerCount = (ushort)(EVar18 == POINTER);
          __return_storage_ptr__->elementSize = EVar18;
          goto code_r0x001c49dc;
        }
        uVar13 = uVar19 * uVar17 + 0x3f >> 6 & 0xffffffff;
        if (((long)pWVar14 - (long)(pSVar12->ptr).ptr >> 3) + uVar13 <= (pSVar12->ptr).size_) {
          pRVar10 = pSVar12->readLimiter;
          if (uVar13 <= pRVar10->limit) {
            pRVar10->limit = pRVar10->limit - uVar13;
            if ((uVar15 & 7) == 0) {
              if (pRVar10->limit < uVar17) {
                getListAnySize();
                goto LAB_001c48d4;
              }
              pRVar10->limit = pRVar10->limit - uVar17;
            }
            goto LAB_001c4a7f;
          }
          (*pSVar12->arena->_vptr_Arena[3])();
        }
        getListAnySize();
      }
    }
    else {
      getListAnySize();
    }
LAB_001c48d4:
    while( true ) {
      pWVar23 = (WirePointer *)defaultValue;
      if ((pWVar23 == (WirePointer *)0x0) ||
         (uVar15 = (uint)*(uint64_t *)&(pWVar23->offsetAndKind).value,
         (pWVar23->field_1).upper32Bits == 0 && uVar15 == 0)) {
        __return_storage_ptr__->ptr = (byte *)0x0;
        __return_storage_ptr__->elementCount = 0;
        __return_storage_ptr__->step = 0;
        __return_storage_ptr__->segment = (SegmentReader *)0x0;
        __return_storage_ptr__->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
        __return_storage_ptr__->nestingLimit = 0x7fffffff;
        return __return_storage_ptr__;
      }
      pWVar14 = pWVar23 + (long)((int)uVar15 >> 2) + 1;
      defaultValue = (word *)0x0;
      pSVar12 = (SegmentReader *)0x0;
      if (0 < iVar4) break;
LAB_001c4ad9:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8c3,FAILED,"nestingLimit > 0",
                 "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\"",
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&local_38);
    }
  } while( true );
}

Assistant:

ListReader PointerReader::getListAnySize(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, ElementSize::VOID /* dummy */, nestingLimit, false);
}